

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::Select<duckdb::string_t,duckdb::string_t,duckdb::GreaterThan>
                (Vector *left,Vector *right,SelectionVector *sel,idx_t count,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  idx_t iVar1;
  
  if (sel == (SelectionVector *)0x0) {
    sel = FlatVector::IncrementalSelectionVector();
  }
  if (left->vector_type == FLAT_VECTOR) {
    if (right->vector_type == FLAT_VECTOR) {
      iVar1 = SelectFlat<duckdb::string_t,duckdb::string_t,duckdb::GreaterThan,false,false>
                        (left,right,sel,count,true_sel,false_sel);
      return iVar1;
    }
    if (right->vector_type == CONSTANT_VECTOR) {
      iVar1 = SelectFlat<duckdb::string_t,duckdb::string_t,duckdb::GreaterThan,false,true>
                        (left,right,sel,count,true_sel,false_sel);
      return iVar1;
    }
  }
  else if (left->vector_type == CONSTANT_VECTOR) {
    if (right->vector_type == FLAT_VECTOR) {
      iVar1 = SelectFlat<duckdb::string_t,duckdb::string_t,duckdb::GreaterThan,true,false>
                        (left,right,sel,count,true_sel,false_sel);
      return iVar1;
    }
    if (right->vector_type == CONSTANT_VECTOR) {
      iVar1 = SelectConstant<duckdb::string_t,duckdb::string_t,duckdb::GreaterThan>
                        (left,right,sel,count,true_sel,false_sel);
      return iVar1;
    }
  }
  iVar1 = SelectGeneric<duckdb::string_t,duckdb::string_t,duckdb::GreaterThan>
                    (left,right,sel,count,true_sel,false_sel);
  return iVar1;
}

Assistant:

static idx_t Select(Vector &left, Vector &right, const SelectionVector *sel, idx_t count, SelectionVector *true_sel,
	                    SelectionVector *false_sel) {
		if (!sel) {
			sel = FlatVector::IncrementalSelectionVector();
		}
		if (left.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    right.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			return SelectConstant<LEFT_TYPE, RIGHT_TYPE, OP>(left, right, sel, count, true_sel, false_sel);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (left.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		           right.GetVectorType() == VectorType::FLAT_VECTOR) {
			return SelectFlat<LEFT_TYPE, RIGHT_TYPE, OP, true, false>(left, right, sel, count, true_sel, false_sel);
		} else if (left.GetVectorType() == VectorType::FLAT_VECTOR &&
		           right.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			return SelectFlat<LEFT_TYPE, RIGHT_TYPE, OP, false, true>(left, right, sel, count, true_sel, false_sel);
		} else if (left.GetVectorType() == VectorType::FLAT_VECTOR &&
		           right.GetVectorType() == VectorType::FLAT_VECTOR) {
			return SelectFlat<LEFT_TYPE, RIGHT_TYPE, OP, false, false>(left, right, sel, count, true_sel, false_sel);
#endif
		} else {
			return SelectGeneric<LEFT_TYPE, RIGHT_TYPE, OP>(left, right, sel, count, true_sel, false_sel);
		}
	}